

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3ResetOneSchema(sqlite3 *db,int iDb)

{
  u16 *puVar1;
  Db *pDVar2;
  void *p;
  long lVar3;
  long lVar4;
  
  if (-1 < iDb) {
    pDVar2 = db->aDb;
    puVar1 = &(pDVar2[(uint)iDb].pSchema)->schemaFlags;
    *puVar1 = *puVar1 | 8;
    puVar1 = &(pDVar2[1].pSchema)->schemaFlags;
    *puVar1 = *puVar1 | 8;
    *(byte *)&db->mDbFlags = (byte)db->mDbFlags & 0xef;
  }
  if (db->nSchemaLock == 0) {
    lVar3 = 0x18;
    for (lVar4 = 0; lVar4 < db->nDb; lVar4 = lVar4 + 1) {
      p = *(void **)((long)&db->aDb->zDbSName + lVar3);
      if ((*(byte *)((long)p + 0x72) & 8) != 0) {
        sqlite3SchemaClear(p);
      }
      lVar3 = lVar3 + 0x20;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ResetOneSchema(sqlite3 *db, int iDb){
  int i;
  assert( iDb<db->nDb );

  if( iDb>=0 ){
    assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
    DbSetProperty(db, iDb, DB_ResetWanted);
    DbSetProperty(db, 1, DB_ResetWanted);
    db->mDbFlags &= ~DBFLAG_SchemaKnownOk;
  }

  if( db->nSchemaLock==0 ){
    for(i=0; i<db->nDb; i++){
      if( DbHasProperty(db, i, DB_ResetWanted) ){
        sqlite3SchemaClear(db->aDb[i].pSchema);
      }
    }
  }
}